

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GLSL420Pack::NegativeTestBase::testCompute(NegativeTestBase *this)

{
  shaderSource *compute_shader;
  program program;
  shaderSource conmpute_data;
  shaderSource local_218;
  shaderSource local_1f8;
  shaderSource local_1d8;
  shaderSource local_1b8;
  shaderSource local_198 [12];
  
  program.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  conmpute_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conmpute_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  conmpute_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,&conmpute_data);
  local_198[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198[0].m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compute_shader = &conmpute_data;
  Utils::program::build
            (&program,compute_shader,local_198,&local_1b8,&local_1d8,&local_1f8,&local_218,
             (GLchar **)0x0,0,false);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_218.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_1f8.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_1d8.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_1b8.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&local_198[0].m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&conmpute_data.m_parts);
  Utils::program::remove(&program,(char *)compute_shader);
  return false;
}

Assistant:

bool NegativeTestBase::testCompute()
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource conmpute_data;
	initShaderSource(Utils::COMPUTE_SHADER, false, conmpute_data);

	/* Build program */
	try
	{
		program.build(conmpute_data /* compute shader */, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Compilation failed, as expected. Verify that reason of failure is as expected */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Shader compilation error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}

	/* Build process succeded */
	return false;
}